

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_ECC_CURVE_Unmarshal(TPMI_ECC_CURVE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT16_Unmarshal(target,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0xa6;
    if ((*target < 0x11) && ((0x1000cU >> (*target & 0x1f) & 1) != 0)) {
      TVar1 = 0;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMI_ECC_CURVE_Unmarshal(TPMI_ECC_CURVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ECC_CURVE_Unmarshal((TPM_ECC_CURVE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ECC_BN_P256
        case TPM_ECC_BN_P256:
#endif // ECC_BN_P256
#if         ECC_BN_P638
        case TPM_ECC_BN_P638:
#endif // ECC_BN_P638
#if         ECC_NIST_P192
        case TPM_ECC_NIST_P192:
#endif // ECC_NIST_P192
#if         ECC_NIST_P224
        case TPM_ECC_NIST_P224:
#endif // ECC_NIST_P224
#if         ECC_NIST_P256
        case TPM_ECC_NIST_P256:
#endif // ECC_NIST_P256
#if         ECC_NIST_P384
        case TPM_ECC_NIST_P384:
#endif // ECC_NIST_P384
#if         ECC_NIST_P521
        case TPM_ECC_NIST_P521:
#endif // ECC_NIST_P521
#if         ECC_SM2_P256
        case TPM_ECC_SM2_P256:
#endif // ECC_SM2_P256
            break;
        default:
            return TPM_RC_CURVE;
    }
    return TPM_RC_SUCCESS;
}